

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O3

void jieba_word_weight_free(jieba_word_weight_t *wws)

{
  char *__ptr;
  jieba_word_weight_t *pjVar1;
  
  if ((wws != (jieba_word_weight_t *)0x0) && (__ptr = wws->word, __ptr != (char *)0x0)) {
    pjVar1 = wws + 1;
    do {
      free(__ptr);
      pjVar1[-1].word = (char *)0x0;
      __ptr = pjVar1->word;
      pjVar1 = pjVar1 + 1;
    } while (__ptr != (char *)0x0);
  }
  free(wws);
  return;
}

Assistant:

void jieba_word_weight_free(jieba_word_weight_t* wws) {
  jieba_word_weight_t* x = wws;
  while (x && x->word) {
    free(x->word);
    x->word = NULL;
    x++;
  }
  free(wws);
}